

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_delay.h
# Opt level: O2

void __thiscall PlayerDelay::~PlayerDelay(PlayerDelay *this)

{
  Player::~Player(&this->super_Player);
  operator_delete(this);
  return;
}

Assistant:

PlayerDelay(const std::string& name) :
      Player(name)
   {}